

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O0

void sCompRow_to_CompCol(int m,int n,int_t nnz,float *a,int_t *colind,int_t *rowptr,float **at,
                        int_t **rowind,int_t **colptr)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  int_t *piVar4;
  int_t *marker;
  int relpos;
  int col;
  int j;
  int i;
  int_t *rowptr_local;
  int_t *colind_local;
  float *a_local;
  int_t nnz_local;
  int n_local;
  int m_local;
  
  pfVar3 = floatMalloc((long)nnz);
  *at = pfVar3;
  piVar4 = intMalloc(nnz);
  *rowind = piVar4;
  piVar4 = intMalloc(n + 1);
  *colptr = piVar4;
  piVar4 = intCalloc(n);
  for (col = 0; col < m; col = col + 1) {
    for (relpos = rowptr[col]; relpos < rowptr[col + 1]; relpos = relpos + 1) {
      piVar4[colind[relpos]] = piVar4[colind[relpos]] + 1;
    }
  }
  **colptr = 0;
  for (relpos = 0; relpos < n; relpos = relpos + 1) {
    (*colptr)[relpos + 1] = (*colptr)[relpos] + piVar4[relpos];
    piVar4[relpos] = (*colptr)[relpos];
  }
  for (col = 0; col < m; col = col + 1) {
    for (relpos = rowptr[col]; relpos < rowptr[col + 1]; relpos = relpos + 1) {
      iVar1 = colind[relpos];
      iVar2 = piVar4[iVar1];
      (*rowind)[iVar2] = col;
      (*at)[iVar2] = a[relpos];
      piVar4[iVar1] = piVar4[iVar1] + 1;
    }
  }
  superlu_free(piVar4);
  return;
}

Assistant:

void
sCompRow_to_CompCol(int m, int n, int_t nnz, 
		    float *a, int_t *colind, int_t *rowptr,
		    float **at, int_t **rowind, int_t **colptr)
{
    register int i, j, col, relpos;
    int_t *marker;

    /* Allocate storage for another copy of the matrix. */
    *at = (float *) floatMalloc(nnz);
    *rowind = (int_t *) intMalloc(nnz);
    *colptr = (int_t *) intMalloc(n+1);
    marker = (int_t *) intCalloc(n);
    
    /* Get counts of each column of A, and set up column pointers */
    for (i = 0; i < m; ++i)
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) ++marker[colind[j]];
    (*colptr)[0] = 0;
    for (j = 0; j < n; ++j) {
	(*colptr)[j+1] = (*colptr)[j] + marker[j];
	marker[j] = (*colptr)[j];
    }

    /* Transfer the matrix into the compressed column storage. */
    for (i = 0; i < m; ++i) {
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) {
	    col = colind[j];
	    relpos = marker[col];
	    (*rowind)[relpos] = i;
	    (*at)[relpos] = a[j];
	    ++marker[col];
	}
    }

    SUPERLU_FREE(marker);
}